

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O2

int Cec3_ManSimHashKey(word *pSim,int nSims,int nTableSize)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar1 = nSims * 2;
  if (nSims * 2 < 1) {
    uVar1 = 0;
  }
  if ((*pSim & 1) == 0) {
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      uVar2 = uVar2 ^ Cec3_ManSimHashKey::s_Primes[(uint)uVar3 & 0xf] *
                      *(int *)((long)pSim + uVar3 * 4);
    }
  }
  else {
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      uVar2 = uVar2 ^ ~*(uint *)((long)pSim + uVar3 * 4) *
                      Cec3_ManSimHashKey::s_Primes[(uint)uVar3 & 0xf];
    }
  }
  return uVar2 % (uint)nTableSize;
}

Assistant:

int Cec3_ManSimHashKey( word * pSim, int nSims, int nTableSize )
{
    static int s_Primes[16] = { 
        1291, 1699, 1999, 2357, 2953, 3313, 3907, 4177, 
        4831, 5147, 5647, 6343, 6899, 7103, 7873, 8147 };
    unsigned uHash = 0, * pSimU = (unsigned *)pSim;
    int i, nSimsU = 2 * nSims;
    if ( pSimU[0] & 1 )
        for ( i = 0; i < nSimsU; i++ )
            uHash ^= ~pSimU[i] * s_Primes[i & 0xf];
    else
        for ( i = 0; i < nSimsU; i++ )
            uHash ^= pSimU[i] * s_Primes[i & 0xf];
    return (int)(uHash % nTableSize);

}